

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_reset_document_state(fy_parser *fyp)

{
  fy_document_state *pfVar1;
  int line;
  char *fmt;
  
  fy_parser_diag(fyp,0x20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,0xef,"fy_reset_document_state","resetting document state");
  if (fyp->default_document_state == (fy_document_state *)0x0) {
    pfVar1 = fy_document_state_default();
    if (pfVar1 != (fy_document_state *)0x0) goto LAB_001286a9;
    fmt = "fy_document_state_default() failed";
    line = 0xf4;
  }
  else {
    pfVar1 = fy_document_state_copy(fyp->default_document_state);
    if (pfVar1 != (fy_document_state *)0x0) {
LAB_001286a9:
      if (fyp->current_document_state != (fy_document_state *)0x0) {
        fy_document_state_unref(fyp->current_document_state);
      }
      fyp->current_document_state = pfVar1;
      fyp->flow_level = 0;
      fyp->flow = FYFT_NONE;
      fy_parse_flow_list_recycle_all(fyp,&fyp->flow_stack);
      return 0;
    }
    fmt = "fy_document_state_copy() failed";
    line = 0xf8;
  }
  fy_parser_diag(fyp,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,line,"fy_reset_document_state",fmt);
  return -1;
}

Assistant:

int fy_reset_document_state(struct fy_parser *fyp) {
    struct fy_document_state *fyds_new = NULL;

    fyp_scan_debug(fyp, "resetting document state");

    if (!fyp->default_document_state) {
        fyds_new = fy_document_state_default();
        fyp_error_check(fyp, fyds_new, err_out,
                        "fy_document_state_default() failed");
    } else {
        fyds_new = fy_document_state_copy(fyp->default_document_state);
        fyp_error_check(fyp, fyds_new, err_out,
                        "fy_document_state_copy() failed");
    }

    if (fyp->current_document_state)
        fy_document_state_unref(fyp->current_document_state);
    fyp->current_document_state = fyds_new;

    /* TODO check when cleaning flow lists */
    fyp->flow_level = 0;
    fyp->flow = FYFT_NONE;
    fy_parse_flow_list_recycle_all(fyp, &fyp->flow_stack);

    return 0;

    err_out:
    return -1;
}